

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_intarith(ASMState *as,IRIns *ir,x86Arith xa)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  MCode *pMVar5;
  x86Arith xVar6;
  Reg dest;
  int iVar7;
  uint uVar8;
  Reg rb;
  byte *pbVar9;
  uint uVar10;
  byte bVar11;
  uint uVar12;
  x86Op xVar13;
  IRRef local_3c;
  int32_t k;
  x86Arith local_34;
  
  uVar1 = (ir->field_0).op1;
  local_3c = (IRRef)uVar1;
  uVar2 = (ir->field_0).op2;
  k = 0;
  pbVar9 = as->mcp;
  if (as->flagmcp == pbVar9) {
    pbVar9 = pbVar9 + (ulong)(*pbVar9 < 0x84) + 2;
    bVar11 = pbVar9[*pbVar9 == 0xf] & 0xf;
    if (bVar11 < 0xe) {
      if (0xb < bVar11) {
        pbVar9[*pbVar9 == 0xf] = pbVar9[*pbVar9 == 0xf] - 4;
      }
      as->flagmcp = (MCode *)0x0;
      as->mcp = pbVar9;
    }
  }
  bVar11 = *(byte *)((long)as->ir + (ulong)uVar2 * 8 + 6);
  uVar10 = (uint)bVar11;
  if ((char)bVar11 < '\0') {
    uVar12 = 0xbfef;
  }
  else {
    uVar12 = ~(1 << (uVar10 & 0x1f)) & 0xbfef;
    as->weakset = as->weakset & (-2 << (bVar11 & 0x1f) | 0xfffffffeU >> 0x20 - (bVar11 & 0x1f));
  }
  local_34 = xa;
  dest = ra_dest(as,ir,uVar12);
  uVar8 = dest;
  if (((uVar1 != uVar2) && (uVar8 = uVar10, (char)bVar11 < '\0')) &&
     (iVar7 = asm_isk32(as,(uint)uVar2,&k), iVar7 == 0)) {
    iVar7 = asm_swapops(as,ir);
    uVar10 = (uint)uVar2;
    if (iVar7 == 0) {
      uVar10 = local_3c;
      local_3c = (uint)uVar2;
    }
    uVar8._0_2_ = *(IROpT *)((long)ir + 4);
    uVar8._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar8 = asm_fuseloadm(as,local_3c,uVar12 & ~(1 << (dest & 0x1f)),
                          (uint)((0x605fd9U >> (uVar8 & 0x1f) & 1) != 0));
    local_3c = uVar10;
  }
  xVar6 = local_34;
  if ((char)(ir->field_1).t.irt < '\0') {
    asm_guardcc(as,0);
  }
  if (xVar6 == XOg_X_IMUL) {
    uVar3._0_2_ = *(IROpT *)((long)ir + 4);
    uVar3._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar12 = (uint)((0x605fd9U >> (uVar3 & 0x1f) & 1) != 0);
    if ((char)uVar8 < '\0') {
      rb = asm_fuseloadm(as,local_3c,0xbfef,uVar12);
      if ((char)(MCode)k == k) {
        pMVar5 = as->mcp;
        as->mcp = pMVar5 + -1;
        pMVar5[-1] = (MCode)k;
        xVar13 = XO_IMULi8;
      }
      else {
        pMVar5 = as->mcp;
        *(int32_t *)(pMVar5 + -4) = k;
        as->mcp = pMVar5 + -4;
        xVar13 = XO_IMULi;
      }
      uVar4._0_2_ = *(IROpT *)((long)ir + 4);
      uVar4._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_mrm(as,xVar13,-(uint)((0x605fd9U >> (uVar4 & 0x1f) & 1) != 0) & 0x80200 | dest,rb);
      return;
    }
    uVar10 = 0x80200;
    if (uVar12 == 0) {
      uVar10 = 0;
    }
    xVar13 = XO_IMUL;
  }
  else {
    if ((char)uVar8 < '\0') {
      uVar10._0_2_ = *(IROpT *)((long)ir + 4);
      uVar10._2_2_ = *(IRRef1 *)((long)ir + 6);
      emit_gri(as,xVar6 + 0x838100,-(uint)((0x605fd9U >> (uVar10 & 0x1f) & 1) != 0) & 0x80200 | dest
               ,k);
      goto LAB_0013fe6d;
    }
    xVar13 = xVar6 << 0x1b | 0x30000fe;
    uVar12._0_2_ = *(IROpT *)((long)ir + 4);
    uVar12._2_2_ = *(IRRef1 *)((long)ir + 6);
    uVar10 = -(uint)((0x605fd9U >> (uVar12 & 0x1f) & 1) != 0) & 0x80200;
  }
  emit_mrm(as,xVar13,uVar10 | dest,uVar8);
LAB_0013fe6d:
  ra_left(as,dest,local_3c);
  return;
}

Assistant:

static void asm_intarith(ASMState *as, IRIns *ir, x86Arith xa)
{
  IRRef lref = ir->op1;
  IRRef rref = ir->op2;
  RegSet allow = RSET_GPR;
  Reg dest, right;
  int32_t k = 0;
  if (as->flagmcp == as->mcp) {  /* Drop test r,r instruction. */
    MCode *p = as->mcp + ((LJ_64 && *as->mcp < XI_TESTb) ? 3 : 2);
    MCode *q = p[0] == 0x0f ? p+1 : p;
    if ((*q & 15) < 14) {
      if ((*q & 15) >= 12) *q -= 4;  /* L <->S, NL <-> NS */
      as->flagmcp = NULL;
      as->mcp = p;
    }  /* else: cannot transform LE/NLE to cc without use of OF. */
  }
  right = IR(rref)->r;
  if (ra_hasreg(right)) {
    rset_clear(allow, right);
    ra_noweak(as, right);
  }
  dest = ra_dest(as, ir, allow);
  if (lref == rref) {
    right = dest;
  } else if (ra_noreg(right) && !asm_isk32(as, rref, &k)) {
    if (asm_swapops(as, ir)) {
      IRRef tmp = lref; lref = rref; rref = tmp;
    }
    right = asm_fuseloadm(as, rref, rset_clear(allow, dest), irt_is64(ir->t));
  }
  if (irt_isguard(ir->t))  /* For IR_ADDOV etc. */
    asm_guardcc(as, CC_O);
  if (xa != XOg_X_IMUL) {
    if (ra_hasreg(right))
      emit_mrm(as, XO_ARITH(xa), REX_64IR(ir, dest), right);
    else
      emit_gri(as, XG_ARITHi(xa), REX_64IR(ir, dest), k);
  } else if (ra_hasreg(right)) {  /* IMUL r, mrm. */
    emit_mrm(as, XO_IMUL, REX_64IR(ir, dest), right);
  } else {  /* IMUL r, r, k. */
    /* NYI: use lea/shl/add/sub (FOLD only does 2^k) depending on CPU. */
    Reg left = asm_fuseloadm(as, lref, RSET_GPR, irt_is64(ir->t));
    x86Op xo;
    if (checki8(k)) { emit_i8(as, k); xo = XO_IMULi8;
    } else { emit_i32(as, k); xo = XO_IMULi; }
    emit_mrm(as, xo, REX_64IR(ir, dest), left);
    return;
  }
  ra_left(as, dest, lref);
}